

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

void __thiscall Test::Suite::Suite(Suite *this,string *name)

{
  duration<long,_std::ratio<1L,_1000000L>_> dVar1;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<std::shared_ptr<Test::Suite>_> local_51;
  initializer_list<std::shared_ptr<Test::Suite>_> local_50 [2];
  allocator<Test::Suite::TestMethod> local_29;
  initializer_list<Test::Suite::TestMethod> local_28;
  string *local_18;
  string *name_local;
  Suite *this_local;
  
  this->_vptr_Suite = (_func_int **)&PTR__Suite_001a19f8;
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->suiteName,name);
  std::initializer_list<Test::Suite::TestMethod>::initializer_list(&local_28);
  std::allocator<Test::Suite::TestMethod>::allocator(&local_29);
  std::vector<Test::Suite::TestMethod,_std::allocator<Test::Suite::TestMethod>_>::vector
            (&this->testMethods,local_28,&local_29);
  std::allocator<Test::Suite::TestMethod>::~allocator(&local_29);
  std::initializer_list<std::shared_ptr<Test::Suite>_>::initializer_list(local_50);
  std::allocator<std::shared_ptr<Test::Suite>_>::allocator(&local_51);
  std::vector<std::shared_ptr<Test::Suite>,_std::allocator<std::shared_ptr<Test::Suite>_>_>::vector
            (&this->subSuites,local_50[0],&local_51);
  std::allocator<std::shared_ptr<Test::Suite>_>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->currentTestMethodName,"",&local_52);
  std::allocator<char>::~allocator(&local_52);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->currentTestMethodArgs,"",&local_53);
  std::allocator<char>::~allocator(&local_53);
  dVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::zero();
  (this->totalDuration).__r = dVar1.__r;
  this->output = (Output *)0x0;
  this->positiveTestMethods = 0;
  this->continueAfterFail = true;
  this->currentTestSucceeded = false;
  return;
}

Assistant:

Suite::Suite(const std::string &name)
    : suiteName(name), testMethods({}), subSuites({}), currentTestMethodName(""), currentTestMethodArgs(""),
      totalDuration(std::chrono::microseconds::zero()), output(nullptr), positiveTestMethods(0),
      continueAfterFail(true), currentTestSucceeded(false) {}